

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O0

void __thiscall
test::iu_FilePath_x_iutest_x_RemoveDirectoryName_Test::Body
          (iu_FilePath_x_iutest_x_RemoveDirectoryName_Test *this)

{
  bool bVar1;
  char *pcVar2;
  iuFilePath *in_R9;
  AssertionHelper local_460;
  Fixed local_430;
  iuFilePath local_2a8;
  undefined1 local_288 [8];
  AssertionResult iutest_ar_1;
  FilePath path_1;
  Fixed local_210;
  iuFilePath local_88;
  undefined1 local_68 [8];
  AssertionResult iutest_ar;
  undefined1 local_30 [8];
  FilePath path;
  iu_FilePath_x_iutest_x_RemoveDirectoryName_Test *this_local;
  
  path.m_path.field_2._8_8_ = this;
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)local_30,"test.exe");
  iutest::detail::AlwaysZero();
  iutest::detail::iuFilePath::RemoveDirectoryName(&local_88,(iuFilePath *)local_30);
  iutest::internal::backward::EqHelper<false>::Compare<char[9],iutest::detail::iuFilePath>
            ((AssertionResult *)local_68,(EqHelper<false> *)"\"test.exe\"",
             "path.RemoveDirectoryName()","test.exe",(char (*) [9])&local_88,in_R9);
  iutest::detail::iuFilePath::~iuFilePath(&local_88);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    memset(&local_210,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_210);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_68);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)((long)&path_1.m_path.field_2 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xd4,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)((long)&path_1.m_path.field_2 + 8),&local_210);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)((long)&path_1.m_path.field_2 + 8))
    ;
    iutest::AssertionHelper::Fixed::~Fixed(&local_210);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)local_30);
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)&iutest_ar_1.m_result,"test/test.exe");
  iutest::detail::AlwaysZero();
  iutest::detail::iuFilePath::RemoveDirectoryName(&local_2a8,(iuFilePath *)&iutest_ar_1.m_result);
  iutest::internal::backward::EqHelper<false>::Compare<char[9],iutest::detail::iuFilePath>
            ((AssertionResult *)local_288,(EqHelper<false> *)"\"test.exe\"",
             "path.RemoveDirectoryName()","test.exe",(char (*) [9])&local_2a8,in_R9);
  iutest::detail::iuFilePath::~iuFilePath(&local_2a8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    memset(&local_430,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_430);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_288);
    iutest::AssertionHelper::AssertionHelper
              (&local_460,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xd8,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_460,&local_430);
    iutest::AssertionHelper::~AssertionHelper(&local_460);
    iutest::AssertionHelper::Fixed::~Fixed(&local_430);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)&iutest_ar_1.m_result);
  return;
}

Assistant:

IUTEST(FilePath, RemoveDirectoryName)
{
    {
        ::iutest::internal::FilePath path("test.exe");
        IUTEST_EXPECT_EQ("test.exe", path.RemoveDirectoryName());
    }
    {
        ::iutest::internal::FilePath path("test/test.exe");
        IUTEST_EXPECT_EQ("test.exe", path.RemoveDirectoryName());
    }
}